

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O3

int ovf::detail::write::increment_n_segments(ovf_file *file)

{
  uint __val;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint __len;
  string new_n_str;
  string padding;
  fstream filestream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [16];
  ostream local_228 [512];
  
  parse::file_header(file);
  uVar4 = file->n_segments + 1;
  file->n_segments = uVar4;
  __val = -uVar4;
  if (0 < (int)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_0015240b;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_0015240b;
      }
      if (uVar2 < 10000) goto LAB_0015240b;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_0015240b:
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_298,(char)__len - (char)((int)uVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_298._M_dataplus._M_p + (uVar4 >> 0x1f),__len,__val);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_258,'\x06' - (char)local_298._M_string_length);
  std::fstream::fstream(local_238,file->file_name,_S_out|_S_in);
  std::istream::seekg(local_238,(file->_state->n_segments_pos)._M_off,
                      (file->_state->n_segments_pos)._M_state);
  std::operator+(&local_278,&local_258,&local_298);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_228,local_278._M_dataplus._M_p,local_278._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  std::fstream::close();
  std::fstream::~fstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return -1;
}

Assistant:

inline int increment_n_segments(ovf_file *file)
    try
    {
        parse::file_header(*file);

        // Update n_segments
        file->n_segments++;

        // Convert updated n_segment into padded string
        std::string new_n_str = std::to_string( file->n_segments );
        std::string::size_type new_n_len = new_n_str.length();
        std::string::size_type padding_len = n_segments_str_digits - new_n_len;
        std::string padding( padding_len, '0' );

        // Replace n_segments value in the stream
        std::fstream filestream( file->file_name );
        filestream.seekg( file->_state->n_segments_pos );
        filestream << ( padding + new_n_str );
        filestream.close();

        return OVF_OK;
    }
    catch( ... )
    {
        file->_state->message_latest = fmt::format("increment_n_segments failed for file \"{}\".", file->file_name);
        return OVF_ERROR;
    }